

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O1

void __thiscall icu_63::MeasureUnit::initNoUnit(MeasureUnit *this,char *subtype)

{
  int start;
  int32_t iVar1;
  
  iVar1 = binarySearch((char **)gTypes,0,0x14,"none");
  this->fTypeId = iVar1;
  start = (&gOffsets)[iVar1];
  iVar1 = binarySearch((char **)gSubTypes,start,(&DAT_00302524)[iVar1],subtype);
  this->fSubTypeId = iVar1 - start;
  return;
}

Assistant:

void MeasureUnit::initNoUnit(const char *subtype) {
    int32_t result = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), "none");
    U_ASSERT(result != -1);
    fTypeId = result;
    result = binarySearch(gSubTypes, gOffsets[fTypeId], gOffsets[fTypeId + 1], subtype);
    U_ASSERT(result != -1);
    fSubTypeId = result - gOffsets[fTypeId];
}